

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_spi.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::SPIFailureChecker::GetResult
          (AssertionResult *__return_storage_ptr__,SPIFailureChecker *this,string *substr)

{
  Type TVar1;
  char *pcVar2;
  AssertionResult *pAVar3;
  TestPartResult *value;
  char *__needle;
  AssertionResult local_d0;
  AssertionResult local_a8;
  iuCodeMessage *local_80;
  TestPartResult *tr;
  size_t i;
  AssertionResult local_60;
  undefined1 local_31;
  TestPartResult *local_30;
  size_t num;
  char *expected;
  string *substr_local;
  SPIFailureChecker *this_local;
  AssertionResult *ar;
  
  pcVar2 = "1 non-fatal failure";
  if (this->m_Type == kFatalFailure) {
    pcVar2 = "1 fatal failure";
  }
  num = (size_t)pcVar2;
  expected = (char *)substr;
  substr_local = (string *)this;
  this_local = (SPIFailureChecker *)__return_storage_ptr__;
  local_30 = (TestPartResult *)
             NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::
             count(&this->super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (local_30 == (TestPartResult *)0x1) {
    local_80 = &NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::
                GetTestPartResult(&this->super_Collector<iutest::detail::NoTestPartResultReporter>,0
                                 )->super_iuCodeMessage;
    TVar1 = TestPartResult::type((TestPartResult *)local_80);
    if (TVar1 == this->m_Type) {
      pcVar2 = iuCodeMessage::message(local_80);
      __needle = (char *)std::__cxx11::string::c_str();
      pcVar2 = strstr(pcVar2,__needle);
      if (pcVar2 == (char *)0x0) {
        AssertionFailure();
        pAVar3 = AssertionResult::operator<<(&local_d0,(char (*) [18])"error: Expected: ");
        pAVar3 = AssertionResult::operator<<(pAVar3,(char **)&num);
        pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
        pAVar3 = AssertionResult::operator<<
                           (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)expected);
        pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [13])"\"\n  Actual:\n");
        pAVar3 = AssertionResult::operator<<(pAVar3,(TestPartResult *)local_80);
        AssertionResult::AssertionResult(__return_storage_ptr__,pAVar3);
        AssertionResult::~AssertionResult(&local_d0);
      }
      else {
        AssertionSuccess();
      }
    }
    else {
      AssertionFailure();
      pAVar3 = AssertionResult::operator<<(&local_a8,(char (*) [18])"error: Expected: ");
      pAVar3 = AssertionResult::operator<<(pAVar3,(char **)&num);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [13])"\"\n  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,(TestPartResult *)local_80);
      AssertionResult::AssertionResult(__return_storage_ptr__,pAVar3);
      AssertionResult::~AssertionResult(&local_a8);
    }
  }
  else {
    local_31 = 0;
    AssertionFailure();
    pAVar3 = AssertionResult::operator<<(&local_60,(char (*) [18])"error: Expected: ");
    pAVar3 = AssertionResult::operator<<(pAVar3,(char **)&num);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [12])"\n  Actual: ");
    pAVar3 = AssertionResult::operator<<(pAVar3,(unsigned_long *)&local_30);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])" failures\n");
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar3);
    AssertionResult::~AssertionResult(&local_60);
    for (tr = (TestPartResult *)0x0; tr < local_30;
        tr = (TestPartResult *)&(tr->super_iuCodeMessage).m_message.field_0x1) {
      value = NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>::
              GetTestPartResult(&this->super_Collector<iutest::detail::NoTestPartResultReporter>,
                                (size_t)tr);
      AssertionResult::operator<<(__return_storage_ptr__,value);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(const ::std::string& substr)
    {
        const char* expected =
            (m_Type == TestPartResult::kFatalFailure) ? "1 fatal failure" : "1 non-fatal failure";
        const size_t num = count();
        if( num != 1 )
        {
            AssertionResult ar = AssertionFailure() << "error: Expected: " << expected
                << "\n  Actual: " << num << " failures\n";
            for( size_t i=0; i < num; ++i )
            {
                ar << GetTestPartResult(i);
            }
            return ar;
        }

        const TestPartResult& tr = GetTestPartResult(0);
        if( tr.type() != m_Type )
        {
            return AssertionFailure() << "error: Expected: " << expected
                << "\"\n  Actual:\n" << tr;
        }

        if( strstr(tr.message(), substr.c_str()) == NULL )
        {
            return AssertionFailure() << "error: Expected: " << expected
                << " containing \"" << substr
                << "\"\n  Actual:\n" << tr;
        }
        return AssertionSuccess();
    }